

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# probe.c
# Opt level: O3

void movingAtomListProcessing(atom *initAtomLst,void *userdata)

{
  int iVar1;
  int iVar2;
  atom *paVar3;
  int rescnt;
  residue_t *prVar4;
  atom *atomlist;
  char prevChain [5];
  chainEndData_t endData;
  char local_e6;
  char local_e5 [5];
  atom_t *local_e0;
  chainEndData_t local_d8;
  
  rescnt = 0;
  memset(&local_d8,0,0xa4);
  local_e5[0] = '?';
  local_e5[1] = '?';
  local_e5[2] = 0;
  if (initAtomLst != (atom *)0x0) {
    local_e6 = ' ';
    iVar2 = 0;
    paVar3 = (atom *)0x0;
    do {
      atomlist = initAtomLst;
      initAtomLst = atomlist->next;
      prVar4 = atomlist->r;
      atomlist->next = paVar3;
      if ((prVar4->resid == iVar2) && (prVar4->resInsCode == local_e6)) {
        iVar1 = strcmp(prVar4->chain,local_e5);
        if (iVar1 != 0) goto LAB_0012c05e;
      }
      else {
LAB_0012c05e:
        local_e0 = initAtomLst;
        if (rescnt != 0) {
          hisNHcheck(&local_d8,atomlist,rescnt);
          prVar4 = atomlist->r;
        }
        iVar2 = strcmp(prVar4->chain,local_e5);
        CtermCheck(&local_d8,rescnt,(uint)(iVar2 != 0));
        rescnt = rescnt + 1;
        prVar4 = atomlist->r;
        iVar2 = strcmp(prVar4->chain,local_e5);
        local_d8.ambigN[4] = (atom *)0x0;
        local_d8.ambigN[5] = (atom *)0x0;
        local_d8.ambigN[6] = (atom *)0x0;
        local_d8.ambigN[7] = (atom *)0x0;
        local_d8.ambigO[0] = (atom *)0x0;
        local_d8.ambigO[1] = (atom *)0x0;
        local_d8.ambigO[2] = (atom *)0x0;
        local_d8.ambigO[3] = (atom *)0x0;
        local_d8.ambigO[4] = (atom *)0x0;
        local_d8.ambigO[5] = (atom *)0x0;
        local_d8.ambigO[6] = (atom *)0x0;
        local_d8.ambigO[7] = (atom *)0x0;
        local_d8.res_mc_oxy_cnt = 0;
        if (iVar2 != 0) {
          local_d8.first = rescnt;
        }
        iVar2 = prVar4->resid;
        local_e6 = prVar4->resInsCode;
        strcpy(local_e5,prVar4->chain);
        initAtomLst = local_e0;
      }
      prVar4->rescnt = rescnt;
      ProcessResInfo(&local_d8,atomlist);
      paVar3 = atomlist;
    } while (initAtomLst != (atom_t *)0x0);
    if (rescnt != 0) {
      hisNHcheck(&local_d8,atomlist,rescnt);
      CtermCheck(&local_d8,rescnt,1);
    }
  }
  return;
}

Assistant:

void movingAtomListProcessing(atom *initAtomLst, void *userdata)
{
   int previd = 0, rescnt = 0;
   char prevInsCode = ' ';
   char prevChain[5];
   atom *a = NULL, *prevAtomLst = NULL, *nexta = NULL;
   chainEndData_t endData;

   initEndData(&endData);

   prevChain[0] = prevChain[1] = '?';
   prevChain[2] = '\0';

   for(a=initAtomLst; a; a = nexta) {
      nexta = a->next;

      a->next = prevAtomLst; /* remove a from initial atom list */
      prevAtomLst = a;       /* and build up a reversed list of */
                             /* only atoms previously seen      */

      if (a->r->resid != previd || a->r->resInsCode != prevInsCode
                             || strcmp(a->r->chain, prevChain) != 0) {

	 if (rescnt){
	    resCheck(&endData, prevAtomLst, rescnt);
	 }
	 CtermCheck(&endData, rescnt, (strcmp(a->r->chain, prevChain) != 0));

	 ++rescnt;

	 NtermCheck(&endData, rescnt, (strcmp(a->r->chain, prevChain) != 0));
	 previd = a->r->resid;
	 prevInsCode = a->r->resInsCode;
	 strcpy(prevChain, a->r->chain);
         //prevChain[2] = '\0';
      }
      a->r->rescnt = rescnt;

      ProcessResInfo(&endData, a);
   }

   if (rescnt) { resCheck(&endData, prevAtomLst, rescnt); }
   CtermCheck(&endData, rescnt, TRUE);
}